

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O3

uint32_t spvtools::opt::anon_unknown_0::ElementWidth(Type *type)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  _func_int **pp_Var2;
  undefined4 extraout_var_00;
  
  pp_Var2 = type->_vptr_Type;
  while( true ) {
    iVar1 = (*pp_Var2[0xe])(type);
    if (CONCAT44(extraout_var,iVar1) == 0) break;
    type = *(Type **)(CONCAT44(extraout_var,iVar1) + 0x28);
    pp_Var2 = type->_vptr_Type;
  }
  iVar1 = (*type->_vptr_Type[0xc])(type);
  lVar3 = CONCAT44(extraout_var_00,iVar1);
  if (lVar3 == 0) {
    iVar1 = (*type->_vptr_Type[10])(type);
    if (CONCAT44(extraout_var_01,iVar1) == 0) {
      __assert_fail("type->AsInteger()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                    ,0x55,
                    "uint32_t spvtools::opt::(anonymous namespace)::ElementWidth(const analysis::Type *)"
                   );
    }
    iVar1 = (*type->_vptr_Type[10])(type);
    lVar3 = CONCAT44(extraout_var_02,iVar1);
  }
  return *(uint32_t *)(lVar3 + 0x24);
}

Assistant:

uint32_t ElementWidth(const analysis::Type* type) {
  if (const analysis::Vector* vec_type = type->AsVector()) {
    return ElementWidth(vec_type->element_type());
  } else if (const analysis::Float* float_type = type->AsFloat()) {
    return float_type->width();
  } else {
    assert(type->AsInteger());
    return type->AsInteger()->width();
  }
}